

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

void __thiscall
CaPS_SA::Suffix_Array<unsigned_long>::sort_partition
          (Suffix_Array<unsigned_long> *this,idx_t_conflict *X,idx_t_conflict *Y,idx_t_conflict n,
          idx_t_conflict *S,idx_t_conflict *LCP_x,idx_t_conflict *LCP_y)

{
  ulong in_RCX;
  idx_t_conflict *Z;
  idx_t_conflict *LCP_y_00;
  long *in_R8;
  idx_t_conflict *in_R9;
  anon_class_72_9_784720f0 g;
  anon_class_56_7_cdff25e5 f;
  idx_t_conflict flat_count_r;
  idx_t_conflict flat_count_l;
  idx_t_conflict m;
  anon_class_72_9_784720f0 *in_stack_ffffffffffffff18;
  anon_class_72_9_784720f0 *in_stack_ffffffffffffff20;
  idx_t_conflict *LCP_x_00;
  undefined1 *len_y;
  idx_t_conflict *Y_00;
  undefined1 *len_x;
  idx_t_conflict *X_00;
  Suffix_Array<unsigned_long> *this_00;
  
  if (in_RCX != 1) {
    Z = (idx_t_conflict *)(in_RCX >> 1);
    LCP_y_00 = (idx_t_conflict *)(in_R8[(long)Z] - *in_R8);
    LCP_x_00 = (idx_t_conflict *)&stack0xffffffffffffffe8;
    len_y = &stack0xfffffffffffffff0;
    Y_00 = (idx_t_conflict *)&stack0xffffffffffffffc8;
    len_x = &stack0xffffffffffffffd8;
    X_00 = (idx_t_conflict *)&stack0x00000008;
    this_00 = (Suffix_Array<unsigned_long> *)&stack0xffffffffffffffd0;
    if ((LCP_y_00 < (idx_t_conflict *)0x2000) || ((ulong)(in_R8[in_RCX] - in_R8[(long)Z]) < 0x2000))
    {
      sort_partition::anon_class_56_7_cdff25e5::operator()
                ((anon_class_56_7_cdff25e5 *)in_stack_ffffffffffffff20);
      sort_partition::anon_class_72_9_784720f0::operator()(in_stack_ffffffffffffff20);
    }
    else {
      parlay::
      par_do<CaPS_SA::Suffix_Array<unsigned_long>::sort_partition(unsigned_long*,unsigned_long*,unsigned_long,unsigned_long_const*,unsigned_long*,unsigned_long*)::_lambda()_1_const&,CaPS_SA::Suffix_Array<unsigned_long>::sort_partition(unsigned_long*,unsigned_long*,unsigned_long,unsigned_long_const*,unsigned_long*,unsigned_long*)::_lambda()_2_const&>
                ((anon_class_56_7_cdff25e5 *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 false);
    }
    merge(this_00,X_00,(idx_t_conflict)len_x,Y_00,(idx_t_conflict)len_y,LCP_x_00,LCP_y_00,Z,in_R9);
  }
  return;
}

Assistant:

void Suffix_Array<T_idx_>::sort_partition(idx_t* const X, idx_t* const Y, const idx_t n, const idx_t* const S, idx_t* const LCP_x, idx_t* const LCP_y)
{
    if(n == 1)
        return;

    const auto m = n / 2;
    const auto flat_count_l = S[m] - S[0];
    const auto flat_count_r = S[n] - S[m];

    const auto f = [&](){ sort_partition(Y, X, m, S, LCP_y, LCP_x); };
    const auto g = [&](){ sort_partition(Y + flat_count_l, X + flat_count_l, n - m, S + m, LCP_y + flat_count_l, LCP_x + flat_count_l); };

    (flat_count_l < nested_par_grain_size || flat_count_r < nested_par_grain_size) ?
        (f(), g()) : parlay::par_do(f, g);
    merge(X, flat_count_l, X + flat_count_l, flat_count_r, LCP_x, LCP_x + flat_count_l, Y, LCP_y);
}